

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O1

Expression * __thiscall
wasm::TranslateToFuzzReader::makeTrappingRefUse(TranslateToFuzzReader *this,HeapType type)

{
  uint32_t uVar1;
  Expression *pEVar2;
  uint uVar3;
  
  uVar1 = Random::upTo(&this->random,100);
  uVar3 = (uint)(0x7c < type.id) * 4 + 3;
  if (uVar1 < 5) {
    if ((uVar3 & (uint)type.id) != 0) {
LAB_00136432:
      __assert_fail("!(heapType.getID() & (TupleMask | NullMask | (heapType.isBasic() ? 0 : ExactMask)))"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-type.h"
                    ,0x14c,"wasm::Type::Type(HeapType, Nullability, Exactness)");
    }
    type.id = type.id | 2;
  }
  else {
    if ((uVar3 & (uint)type.id) != 0) goto LAB_00136432;
    if ((0x45 < uVar1) && (this->funcContext != (FunctionCreationContext *)0x0)) {
      pEVar2 = makeLocalGet(this,(Type)type.id);
      return pEVar2;
    }
  }
  pEVar2 = make(this,(Type)type.id);
  return pEVar2;
}

Assistant:

Expression* TranslateToFuzzReader::makeTrappingRefUse(HeapType type) {
  auto percent = upTo(100);
  // Only give a low probability to emit a nullable reference.
  if (percent < 5) {
    return make(Type(type, Nullable));
  }
  // Otherwise, usually emit a non-nullable one.
  auto nonNull = Type(type, NonNullable);
  if (percent < 70 || !funcContext) {
    return make(nonNull);
  }
  // With significant probability, try to use an existing value, that is, to
  // get a value using local.get, as it is better to have patterns like this:
  //
  //  (local.set $ref (struct.new $..
  //  (struct.get (local.get $ref))
  //
  // Rather than constantly operating on new data each time:
  //
  //  (local.set $ref (struct.new $..
  //  (struct.get (struct.new $..
  //
  // By using local values more, we get more coverage of interesting sequences
  // of reads and writes to the same objects.
  //
  // Note that makeLocalGet will add a local if necessary, and even tee that
  // value so it is usable later as well.
  return makeLocalGet(nonNull);
}